

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

uint qcc_arena_add_object(qcc_arena *arena,void *ptr,qcc_destroy_fn dtor)

{
  size_t sVar1;
  qcc_destroy_fn dtor_local;
  void *ptr_local;
  qcc_arena *arena_local;
  
  sVar1 = qcc_arena_memory_available(arena);
  if (0xf < sVar1) {
    arena->objects = arena->objects + -1;
    arena->objects->ptr = ptr;
    arena->objects->dtor = dtor;
  }
  arena_local._4_4_ = (uint)(0xf < sVar1);
  return arena_local._4_4_;
}

Assistant:

unsigned qcc_arena_add_object(struct qcc_arena *arena, void *ptr,
                              qcc_destroy_fn dtor)
{
    if (qcc_arena_memory_available(arena) < sizeof(struct qcc_arena_object))
        return 0;

    --arena->objects;
    arena->objects->ptr = ptr;
    arena->objects->dtor = dtor;
    return 1;
}